

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint ON_SubDEdgeChain::SortEdgesIntoEdgeChains
               (ON_SimpleArray<ON_SubDComponentPtr> *unsorted_edges,
               ON_SimpleArray<ON_SubDEdgePtr> *sorted_edges)

{
  ON_SubDEdgePtr *unsorted_edges_00;
  ulong uVar1;
  uint uVar2;
  uint i;
  ulong uVar3;
  uint i_1;
  ulong unsorted_edges_count;
  ON_SimpleArray<ON_SubDEdgePtr> local_unsorted_edges;
  ON_SubDEdgePtr local_50;
  ON_SimpleArray<ON_SubDEdgePtr> local_48;
  
  unsorted_edges_00 = (ON_SubDEdgePtr *)unsorted_edges->m_a;
  unsorted_edges_count = (ulong)(uint)unsorted_edges->m_count;
  for (uVar3 = 0; unsorted_edges_count != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = unsorted_edges_00[uVar3].m_ptr;
    if ((((uint)uVar1 & 6) != 4) && (7 < uVar1 && (uVar1 & 6) != 0)) goto LAB_005f05f0;
  }
  if (unsorted_edges_00 != sorted_edges->m_a) {
    uVar2 = Internal_MuchImprovedSortEdgesIntoChains
                      ((ON__UINT_PTR *)unsorted_edges_00,unsorted_edges_count,sorted_edges);
    return uVar2;
  }
LAB_005f05f0:
  ON_SimpleArray<ON_SubDEdgePtr>::ON_SimpleArray(&local_48,unsorted_edges_count);
  for (uVar3 = 0; unsorted_edges_count != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = unsorted_edges->m_a[uVar3].m_ptr;
    if (((uint)uVar1 & 6) == 4) {
      local_50.m_ptr = uVar1 & 0xfffffffffffffff9;
      ON_SimpleArray<ON_SubDEdgePtr>::Append(&local_48,&local_50);
    }
  }
  uVar2 = Internal_MuchImprovedSortEdgesIntoChains
                    (&(local_48.m_a)->m_ptr,(ulong)(uint)unsorted_edges->m_count,sorted_edges);
  ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray(&local_48);
  return uVar2;
}

Assistant:

unsigned int ON_SubDEdgeChain::SortEdgesIntoEdgeChains(
  const ON_SimpleArray< ON_SubDComponentPtr >& unsorted_edges,
  ON_SimpleArray< ON_SubDEdgePtr >& sorted_edges
)
{
  unsigned int chain_count = 0;
  bool bCopyInput = (const void*)unsorted_edges.Array() == (const void*)sorted_edges.Array();
  const unsigned unsorted_edges_count = unsorted_edges.Count();
  for (unsigned i = 0; i < unsorted_edges_count; ++i)
  {
    ON_SubDComponentPtr cptr = unsorted_edges[i];
    if (cptr.IsEdge() || cptr.IsNull())
      continue;
    bCopyInput = true;
    break;
  }
  if (bCopyInput)
  {
    ON_SimpleArray< ON_SubDEdgePtr > local_unsorted_edges(unsorted_edges_count);
    for (unsigned i = 0; i < unsorted_edges_count; ++i)
    {
      ON_SubDComponentPtr cptr = unsorted_edges[i];
      if (cptr.IsEdge())
        local_unsorted_edges.Append(cptr.EdgePtr());
    }
    chain_count = Internal_MuchImprovedSortEdgesIntoChains(
      (const ON__UINT_PTR*)local_unsorted_edges.Array(),
      unsorted_edges.UnsignedCount(),
      sorted_edges
    );
  }
  else
  {
    chain_count = Internal_MuchImprovedSortEdgesIntoChains(
      (const ON__UINT_PTR*)unsorted_edges.Array(),
      unsorted_edges.UnsignedCount(),
      sorted_edges
    );
  }
  return chain_count;
}